

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page-queue.c
# Opt level: O0

void mi_page_queue_enqueue_from_ex
               (mi_page_queue_t *to,mi_page_queue_t *from,_Bool enqueue_at_end,mi_page_t *page)

{
  mi_page_s *pmVar1;
  _Bool in_full;
  mi_page_t *in_RCX;
  byte in_DL;
  long *in_RSI;
  mi_page_queue_t *in_RDI;
  mi_page_queue_t *in_stack_00000008;
  mi_page_t *next;
  mi_heap_t *heap;
  size_t bsize;
  
  mi_page_block_size(in_RCX);
  mi_page_heap(in_RCX);
  if (in_RCX->prev != (mi_page_s *)0x0) {
    in_RCX->prev->next = in_RCX->next;
  }
  if (in_RCX->next != (mi_page_s *)0x0) {
    in_RCX->next->prev = in_RCX->prev;
  }
  if (in_RCX == (mi_page_t *)in_RSI[1]) {
    in_RSI[1] = (long)in_RCX->prev;
  }
  if (in_RCX == (mi_page_t *)*in_RSI) {
    *in_RSI = (long)in_RCX->next;
    mi_heap_queue_first_update((mi_heap_t *)next,in_stack_00000008);
  }
  if ((in_DL & 1) == 0) {
    if (in_RDI->first == (mi_page_t *)0x0) {
      in_RCX->prev = (mi_page_s *)0x0;
      in_RCX->next = (mi_page_s *)0x0;
      in_RDI->first = in_RCX;
      in_RDI->last = in_RCX;
      mi_heap_queue_first_update((mi_heap_t *)next,in_stack_00000008);
    }
    else {
      pmVar1 = in_RDI->first->next;
      in_RCX->prev = in_RDI->first;
      in_RCX->next = pmVar1;
      in_RDI->first->next = in_RCX;
      if (pmVar1 == (mi_page_s *)0x0) {
        in_RDI->last = in_RCX;
      }
      else {
        pmVar1->prev = in_RCX;
      }
    }
  }
  else {
    in_RCX->prev = in_RDI->last;
    in_RCX->next = (mi_page_s *)0x0;
    if (in_RDI->last == (mi_page_t *)0x0) {
      in_RDI->first = in_RCX;
      in_RDI->last = in_RCX;
      mi_heap_queue_first_update((mi_heap_t *)next,in_stack_00000008);
    }
    else {
      in_RDI->last->next = in_RCX;
      in_RDI->last = in_RCX;
    }
  }
  in_full = mi_page_queue_is_full(in_RDI);
  mi_page_set_in_full(in_RCX,in_full);
  return;
}

Assistant:

static void mi_page_queue_enqueue_from_ex(mi_page_queue_t* to, mi_page_queue_t* from, bool enqueue_at_end, mi_page_t* page) {
  mi_assert_internal(page != NULL);
  mi_assert_expensive(mi_page_queue_contains(from, page));
  mi_assert_expensive(!mi_page_queue_contains(to, page));
  const size_t bsize = mi_page_block_size(page);
  MI_UNUSED(bsize);
  mi_assert_internal((bsize == to->block_size && bsize == from->block_size) ||
                     (bsize == to->block_size && mi_page_queue_is_full(from)) ||
                     (bsize == from->block_size && mi_page_queue_is_full(to)) ||
                     (mi_page_is_large_or_huge(page) && mi_page_queue_is_huge(to)) ||
                     (mi_page_is_large_or_huge(page) && mi_page_queue_is_full(to)));

  mi_heap_t* heap = mi_page_heap(page);

  // delete from `from`
  if (page->prev != NULL) page->prev->next = page->next;
  if (page->next != NULL) page->next->prev = page->prev;
  if (page == from->last)  from->last = page->prev;
  if (page == from->first) {
    from->first = page->next;
    // update first
    mi_assert_internal(mi_heap_contains_queue(heap, from));
    mi_heap_queue_first_update(heap, from);
  }

  // insert into `to`
  if (enqueue_at_end) {
    // enqueue at the end
    page->prev = to->last;
    page->next = NULL;
    if (to->last != NULL) {
      mi_assert_internal(heap == mi_page_heap(to->last));
      to->last->next = page;
      to->last = page;
    }
    else {
      to->first = page;
      to->last = page;
      mi_heap_queue_first_update(heap, to);
    }
  }
  else {
    if (to->first != NULL) {
      // enqueue at 2nd place
      mi_assert_internal(heap == mi_page_heap(to->first));
      mi_page_t* next = to->first->next;
      page->prev = to->first;
      page->next = next;
      to->first->next = page;
      if (next != NULL) {
        next->prev = page;
      }
      else {
        to->last = page;
      }
    }
    else {
      // enqueue at the head (singleton list)
      page->prev = NULL;
      page->next = NULL;
      to->first = page;
      to->last = page;
      mi_heap_queue_first_update(heap, to);
    }
  }

  mi_page_set_in_full(page, mi_page_queue_is_full(to));
}